

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O2

string * __thiscall
common_arg::to_string_abi_cxx11_(string *__return_storage_ptr__,common_arg *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  int iVar3;
  pointer pbVar4;
  char cVar5;
  ostream *poVar6;
  long lVar7;
  istream *piVar8;
  char *pcVar9;
  char *pcVar10;
  pointer pbVar11;
  pointer ppcVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  help_lines;
  string word;
  string leading_spaces;
  value_type local_528;
  string current_line;
  string local_4e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tmp;
  ostringstream ss;
  string spaces;
  
  leading_spaces._M_dataplus._M_p = (pointer)&leading_spaces.field_2;
  std::__cxx11::string::_M_construct((ulong)&leading_spaces,'(');
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  ppcVar1 = (this->args).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar12 = (this->args).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppcVar12 != ppcVar1;
      ppcVar12 = ppcVar12 + 1) {
    pcVar10 = *ppcVar12;
    ppcVar2 = (this->args).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pcVar10 == *ppcVar2) {
      if ((long)(this->args).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                .super__Vector_impl_data._M_finish - (long)ppcVar2 == 8) {
        std::operator<<((ostream *)&ss,pcVar10);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&spaces,pcVar10,(allocator<char> *)&word);
        std::operator+(&tmp,&spaces,", ");
        std::__cxx11::string::~string((string *)&spaces);
        iVar3 = 7 - (int)tmp._M_string_length;
        if (7 - (int)tmp._M_string_length < 1) {
          iVar3 = 0;
        }
        spaces._M_dataplus._M_p = (pointer)&spaces.field_2;
        std::__cxx11::string::_M_construct((ulong)&spaces,(char)iVar3);
        poVar6 = std::operator<<((ostream *)&ss,(string *)&tmp);
        std::operator<<(poVar6,(string *)&spaces);
        std::__cxx11::string::~string((string *)&spaces);
        std::__cxx11::string::~string((string *)&tmp);
      }
    }
    else {
      poVar6 = std::operator<<((ostream *)&ss,pcVar10);
      pcVar9 = ", ";
      if (pcVar10 ==
          (this->args).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish[-1]) {
        pcVar9 = "";
      }
      std::operator<<(poVar6,pcVar9);
    }
  }
  if (this->value_hint != (char *)0x0) {
    poVar6 = std::operator<<((ostream *)&ss," ");
    std::operator<<(poVar6,this->value_hint);
  }
  if (this->value_hint_2 != (char *)0x0) {
    poVar6 = std::operator<<((ostream *)&ss," ");
    std::operator<<(poVar6,this->value_hint_2);
  }
  lVar7 = std::ostream::tellp();
  if (lVar7 < 0x26) {
    cVar5 = std::ostream::tellp();
    tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
    std::__cxx11::string::_M_construct((ulong)&tmp,(char)leading_spaces._M_string_length - cVar5);
    std::operator<<((ostream *)&ss,(string *)&tmp);
    std::__cxx11::string::~string((string *)&tmp);
  }
  else {
    poVar6 = std::operator<<((ostream *)&ss,"\n");
    std::operator<<(poVar6,(string *)&leading_spaces);
  }
  std::__cxx11::string::string(local_4e8,(string *)&this->help);
  help_lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  help_lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  help_lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::istringstream::istringstream((istringstream *)&spaces,local_4e8,_S_in);
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  local_528._M_string_length = 0;
  local_528.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&spaces,(string *)&local_528);
    if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
    if (local_528._M_string_length < 0x47) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&help_lines,&local_528);
    }
    else {
      std::__cxx11::istringstream::istringstream((istringstream *)&tmp,(string *)&local_528,_S_in);
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      current_line._M_dataplus._M_p = (pointer)&current_line.field_2;
      current_line._M_string_length = 0;
      current_line.field_2._M_local_buf[0] = '\0';
      while( true ) {
        piVar8 = std::operator>>((istream *)&tmp,(string *)&word);
        if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
        if (((current_line._M_string_length + 1) - (ulong)(current_line._M_string_length == 0)) +
            word._M_string_length < 0x47) {
          pcVar10 = "";
          if (current_line._M_string_length != 0) {
            pcVar10 = " ";
          }
          std::operator+(&local_4c8,pcVar10,&word);
          std::__cxx11::string::append((string *)&current_line);
          std::__cxx11::string::~string((string *)&local_4c8);
        }
        else {
          if (current_line._M_string_length != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&help_lines,&current_line);
          }
          std::__cxx11::string::_M_assign((string *)&current_line);
        }
      }
      if (current_line._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&help_lines,&current_line);
      }
      std::__cxx11::string::~string((string *)&current_line);
      std::__cxx11::string::~string((string *)&word);
      std::__cxx11::istringstream::~istringstream((istringstream *)&tmp);
    }
  }
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::istringstream::~istringstream((istringstream *)&spaces);
  std::__cxx11::string::~string(local_4e8);
  pbVar4 = help_lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar11 = help_lines.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar4; pbVar11 = pbVar11 + 1
      ) {
    if (pbVar11 ==
        help_lines.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tmp,"",(allocator<char> *)&spaces);
    }
    else {
      std::__cxx11::string::string((string *)&tmp,(string *)&leading_spaces);
    }
    poVar6 = std::operator<<((ostream *)&ss,(string *)&tmp);
    poVar6 = std::operator<<(poVar6,(string *)pbVar11);
    std::operator<<(poVar6,"\n");
    std::__cxx11::string::~string((string *)&tmp);
  }
  std::__cxx11::stringbuf::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&help_lines);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  std::__cxx11::string::~string((string *)&leading_spaces);
  return __return_storage_ptr__;
}

Assistant:

std::string common_arg::to_string() {
    // params for printing to console
    const static int n_leading_spaces = 40;
    const static int n_char_per_line_help = 70; // TODO: detect this based on current console
    std::string leading_spaces(n_leading_spaces, ' ');

    std::ostringstream ss;
    for (const auto arg : args) {
        if (arg == args.front()) {
            if (args.size() == 1) {
                ss << arg;
            } else {
                // first arg is usually abbreviation, we need padding to make it more beautiful
                auto tmp = std::string(arg) + ", ";
                auto spaces = std::string(std::max(0, 7 - (int)tmp.size()), ' ');
                ss << tmp << spaces;
            }
        } else {
            ss << arg << (arg != args.back() ? ", " : "");
        }
    }
    if (value_hint) ss << " " << value_hint;
    if (value_hint_2) ss << " " << value_hint_2;
    if (ss.tellp() > n_leading_spaces - 3) {
        // current line is too long, add new line
        ss << "\n" << leading_spaces;
    } else {
        // padding between arg and help, same line
        ss << std::string(leading_spaces.size() - ss.tellp(), ' ');
    }
    const auto help_lines = break_str_into_lines(help, n_char_per_line_help);
    for (const auto & line : help_lines) {
        ss << (&line == &help_lines.front() ? "" : leading_spaces) << line << "\n";
    }
    return ss.str();
}